

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O2

void wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::scan
               (ReconstructStringifyWalker *self,Expression **currp)

{
  Index IVar1;
  Expression **currp_00;
  Expression *pEVar2;
  Iterator IVar3;
  Expression local_88 [2];
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_60;
  Expression *local_48;
  Expression *curr;
  Index local_38;
  
  local_48 = *currp;
  if (((ulong)local_48->_id < 0x36) &&
     ((0x3000000000000eU >> ((ulong)local_48->_id & 0x3f) & 1) != 0)) {
    std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&(self->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c,
               &local_48);
    Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                *)self,doVisitExpression,currp);
    AbstractChildIterator<wasm::ValueChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ValueChildIterator> *)local_88,local_48);
    local_38 = 0;
    curr = local_88;
    IVar3 = AbstractChildIterator<wasm::ValueChildIterator>::end
                      ((AbstractChildIterator<wasm::ValueChildIterator> *)local_88);
    IVar1 = 0;
    pEVar2 = local_88;
    while ((IVar1 != IVar3.index || (pEVar2 != (Expression *)IVar3.parent))) {
      currp_00 = AbstractChildIterator<wasm::ValueChildIterator>::Iterator::operator*
                           ((Iterator *)&curr);
      PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
      ::scan(self,currp_00);
      IVar1 = local_38 + 1;
      pEVar2 = curr;
      local_38 = IVar1;
    }
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              (&local_60);
    return;
  }
  PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  ::scan(self,currp);
  return;
}

Assistant:

inline void StringifyWalker<SubType>::scan(SubType* self, Expression** currp) {
  Expression* curr = *currp;
  if (Properties::isControlFlowStructure(curr)) {
    self->controlFlowQueue.push(curr);
    DBG(std::cerr << "controlFlowQueue.push: " << ShallowExpression{curr}
                  << ", " << curr << "\n");
    self->pushTask(doVisitExpression, currp);
    // The if-condition is a value child consumed by the if control flow, which
    // makes the if-condition a true sibling rather than part of its contents in
    // the binary format
    for (auto*& child : ValueChildIterator(curr)) {
      Super::scan(self, &child);
    }
  } else {
    Super::scan(self, currp);
  }
}